

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackLog.cxx
# Opt level: O0

bool __thiscall cmCPackLog::SetLogOutputFile(cmCPackLog *this,char *fname)

{
  cmGeneratedFileStream *__s;
  cmGeneratedFileStream *this_00;
  ulong uVar1;
  allocator<char> local_49;
  string local_48;
  cmGeneratedFileStream *local_28;
  cmGeneratedFileStream *cg;
  char *fname_local;
  cmCPackLog *this_local;
  
  local_28 = (cmGeneratedFileStream *)0x0;
  cg = (cmGeneratedFileStream *)fname;
  fname_local = &this->Verbose;
  if (fname != (char *)0x0) {
    this_00 = (cmGeneratedFileStream *)operator_new(0x248);
    __s = cg;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,(char *)__s,&local_49);
    cmGeneratedFileStream::cmGeneratedFileStream(this_00,&local_48,false,None);
    local_28 = this_00;
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  if ((local_28 != (cmGeneratedFileStream *)0x0) &&
     (uVar1 = std::ios::operator!((ios *)((long)&(local_28->super_ofstream).
                                                 super_basic_ostream<char,_std::char_traits<char>_>.
                                                 _vptr_basic_ostream +
                                         (long)(local_28->super_ofstream).
                                               super_basic_ostream<char,_std::char_traits<char>_>.
                                               _vptr_basic_ostream[-3])), (uVar1 & 1) != 0)) {
    if (local_28 != (cmGeneratedFileStream *)0x0) {
      (*(local_28->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
        _vptr_basic_ostream[1])();
    }
    local_28 = (cmGeneratedFileStream *)0x0;
  }
  SetLogOutputStream(this,(ostream *)local_28);
  if (local_28 != (cmGeneratedFileStream *)0x0) {
    this->LogOutputCleanup = true;
  }
  return local_28 != (cmGeneratedFileStream *)0x0;
}

Assistant:

bool cmCPackLog::SetLogOutputFile(const char* fname)
{
  cmGeneratedFileStream* cg = nullptr;
  if (fname) {
    cg = new cmGeneratedFileStream(fname);
  }
  if (cg && !*cg) {
    delete cg;
    cg = nullptr;
  }
  this->SetLogOutputStream(cg);
  if (!cg) {
    return false;
  }
  this->LogOutputCleanup = true;
  return true;
}